

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

TScoredWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRawWithScores
          (TScoredWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,
          size_t position)

{
  pointer *this_00;
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  TWord origWord;
  ulong uVar4;
  size_t i;
  TWord *word;
  undefined8 *puVar5;
  __node_base_ptr p_Var6;
  value_type *__x;
  long lVar7;
  __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
  __i;
  pointer pTVar8;
  undefined1 local_118 [8];
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  undefined1 auStack_b8 [8];
  TWord cand;
  undefined1 local_90 [8];
  TWords candidates;
  TWord c;
  undefined1 auStack_58 [8];
  TWord w;
  
  (__return_storage_ptr__->
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (position <
      (ulong)((long)(sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)) {
    pTVar1 = pTVar1 + position;
    auStack_58 = (undefined1  [8])pTVar1->Ptr;
    w.Ptr = (wchar_t *)pTVar1->Len;
    word = (TWord *)auStack_58;
    Edits2((TWords *)local_90,this,word,true);
    if (local_90 ==
        (undefined1  [8])
        candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_start) {
      Edits((TWords *)local_118,this,(TWord *)auStack_58);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::_M_move_assign
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_90,local_118);
      std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_118);
    }
    if (local_90 !=
        (undefined1  [8])
        candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_118 = (undefined1  [8])&uniqueCandidates._M_h._M_bucket_count;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)local_118,auStack_58,
                 (wchar_t *)((long)(wchar_t **)auStack_58 + (long)w.Ptr * 4));
      join_0x00000010_0x00000000_ = TLangModel::GetWord(&this->LangModel,(wstring *)local_118);
      std::__cxx11::wstring::~wstring((wstring *)local_118);
      if (c.Ptr != (wchar_t *)0x0 &&
          candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        word = (TWord *)&candidates.
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
        auStack_58 = (undefined1  [8])
                     candidates.
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        w.Ptr = c.Ptr;
      }
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_90,word);
      std::
      _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_118,local_90,
                 candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                 _M_impl.super__Vector_impl_data._M_start,0,
                 &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&cand.Len,auStack_b8);
      origWord.Len = (size_t)w.Ptr;
      origWord.Ptr = (wchar_t *)auStack_58;
      FilterCandidatesByFrequency
                (this,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                       *)local_118,origWord);
      std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
                (__return_storage_ptr__,(size_type)uniqueCandidates._M_h._M_before_begin._M_nxt);
      uniqueCandidates._M_h._M_single_bucket = (__node_base_ptr)(position + 2);
      this_00 = &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      for (puVar5 = (undefined8 *)uniqueCandidates._M_h._M_bucket_count; puVar5 != (undefined8 *)0x0
          ; puVar5 = (undefined8 *)*puVar5) {
        auStack_b8 = (undefined1  [8])puVar5[1];
        cand.Ptr = (wchar_t *)puVar5[2];
        stack0xffffffffffffff88 = (TWord)ZEXT816(0);
        lVar7 = 0;
        for (p_Var6 = (__node_base_ptr)0x0;
            pTVar1 = (sentence->
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            p_Var6 < (__node_base_ptr)
                     ((long)(sentence->
                            super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4);
            p_Var6 = (__node_base_ptr)((long)&p_Var6->_M_nxt + 1)) {
          __x = (value_type *)auStack_b8;
          if ((__node_base_ptr)position == p_Var6) {
LAB_00108588:
            std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)this_00,__x);
          }
          else if ((p_Var6 < position && position <= (undefined1 *)((long)&p_Var6->_M_nxt + 2U)) ||
                  (p_Var6 <= uniqueCandidates._M_h._M_single_bucket && position < p_Var6)) {
            __x = (value_type *)((long)&pTVar1->Ptr + lVar7);
            goto LAB_00108588;
          }
          lVar7 = lVar7 + 0x10;
        }
        cand.Len = (size_t)auStack_b8;
        TLangModel::Score(&this->LangModel,(TWords *)this_00);
        std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)&cand.Len);
        std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                  ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)this_00);
      }
      pTVar2 = (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar2 != pTVar3) {
        uVar4 = ((long)pTVar3 - (long)pTVar2) / 0x18;
        lVar7 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                  (pTVar2,pTVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pTVar3 - (long)pTVar2 < 0x181) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                    (pTVar2,pTVar3);
        }
        else {
          pTVar8 = pTVar2 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                    (pTVar2,pTVar8);
          for (; pTVar8 != pTVar3; pTVar8 = pTVar8 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Val_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                      (pTVar8);
          }
        }
      }
      std::
      _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_118);
    }
    std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
              ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

TScoredWords TSpellCorrector::GetCandidatesRawWithScores(const TWords& sentence, size_t position) const {
    TScoredWords scoredCandidates;

    if (position >= sentence.size()) {
        return scoredCandidates;
    }

    TWord w = sentence[position];
    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return scoredCandidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });
    return scoredCandidates;
}